

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

FT_Error afm_parser_parse(AFM_Parser parser)

{
  AFM_FontInfo pAVar1;
  FT_Memory memory;
  AFM_FontInfo pAVar2;
  int iVar3;
  AFM_Token AVar4;
  FT_Int FVar5;
  char *pcVar6;
  AFM_KernPair pAVar7;
  AFM_TrackKern pAVar8;
  FT_Offset *in_RDX;
  FT_Offset *len_00;
  FT_Offset *len_01;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *pFVar9;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  AFM_ValueType_ AVar10;
  AFM_ValueType_ AVar11;
  uint uVar12;
  ulong uVar13;
  FT_Offset len_2;
  FT_Offset len;
  FT_Offset len_1;
  AFM_ValueRec shared_vals [4];
  FT_Offset local_e8;
  FT_Offset local_e0;
  AFM_ValueRec_ local_d8;
  undefined4 local_c8;
  FT_UInt local_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  FT_Fixed local_90;
  FT_Offset local_80;
  AFM_ValueRec_ local_78;
  undefined4 local_68;
  FT_Pos local_60;
  undefined4 local_58;
  FT_Pos local_50;
  undefined4 local_48;
  FT_Pos local_40;
  ulong local_38;
  
  pAVar1 = parser->FontInfo;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    AVar10 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_FIXED;
  }
  else {
    memory = parser->memory;
    pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,in_RDX);
    AVar10 = AFM_VALUE_TYPE_FIXED;
    if (((pcVar6 != (char *)0x0) && (local_e0 == 0x10)) &&
       (iVar3 = strncmp(pcVar6,"StartFontMetrics",0x10), iVar3 == 0)) {
      pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,len_00);
      AVar10 = 0xa0;
      if (pcVar6 != (char *)0x0) {
        do {
          AVar4 = afm_tokenize(pcVar6,local_e0);
          pFVar9 = len_01;
          if ((int)AVar4 < 0x1e) {
            if ((int)AVar4 < 0x14) {
              if (AVar4 == AFM_TOKEN_ASCENDER) {
                local_78.type = AFM_VALUE_TYPE_FIXED;
                FVar5 = afm_parser_read_vals(parser,&local_78,1);
                if (FVar5 != 1) break;
                pAVar1->Ascender = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
                pFVar9 = extraout_RDX_05;
              }
              else if (AVar4 == AFM_TOKEN_DESCENDER) {
                local_78.type = AFM_VALUE_TYPE_FIXED;
                FVar5 = afm_parser_read_vals(parser,&local_78,1);
                if (FVar5 != 1) break;
                pAVar1->Descender = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
                pFVar9 = extraout_RDX;
              }
            }
            else if (AVar4 == AFM_TOKEN_FONTBBOX) {
              local_78.type = AFM_VALUE_TYPE_FIXED;
              local_68 = 2;
              local_58 = 2;
              local_48 = 2;
              FVar5 = afm_parser_read_vals(parser,&local_78,4);
              if (FVar5 != 4) break;
              (pAVar1->FontBBox).xMin = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
              (pAVar1->FontBBox).yMin = local_60;
              (pAVar1->FontBBox).xMax = local_50;
              (pAVar1->FontBBox).yMax = local_40;
              pFVar9 = extraout_RDX_01;
            }
            else if (AVar4 == AFM_TOKEN_ENDFONTMETRICS) {
              return 0;
            }
          }
          else if ((int)AVar4 < 0x2d) {
            if (AVar4 == AFM_TOKEN_ISCIDFONT) {
              local_78.type = AFM_VALUE_TYPE_BOOL;
              FVar5 = afm_parser_read_vals(parser,&local_78,1);
              if (FVar5 != 1) break;
              pAVar1->IsCIDFont = local_78.u.b;
              pFVar9 = extraout_RDX_06;
            }
            else if (AVar4 == AFM_TOKEN_METRICSSETS) {
              local_d8.type = AFM_VALUE_TYPE_INTEGER;
              FVar5 = afm_parser_read_vals(parser,&local_d8,1);
              if (FVar5 != 1) break;
              pFVar9 = extraout_RDX_00;
              if ((local_d8.u.u & 0xfffffffd) != 0) {
                AVar10 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER;
                break;
              }
            }
          }
          else if (AVar4 == AFM_TOKEN_STARTCHARMETRICS) {
            local_d8.type = AFM_VALUE_TYPE_INTEGER;
            FVar5 = afm_parser_read_vals(parser,&local_d8,1);
            if (FVar5 != 1) break;
            iVar3 = local_d8.u.i + 1;
            pFVar9 = extraout_RDX_02;
            while (iVar3 = iVar3 + -1, 0 < iVar3) {
              pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,'\0',pFVar9);
              pFVar9 = extraout_RDX_03;
              if (pcVar6 == (char *)0x0) {
                return 0xa0;
              }
            }
            do {
              pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_d8,pFVar9);
              if (pcVar6 == (char *)0x0) {
                return 0xa0;
              }
              AVar4 = afm_tokenize(pcVar6,CONCAT44(local_d8._4_4_,local_d8.type));
            } while ((AVar4 != AFM_TOKEN_ENDCHARMETRICS) &&
                    (pFVar9 = extraout_RDX_04, AVar4 != AFM_TOKEN_ENDFONTMETRICS));
            AVar10 = AFM_VALUE_TYPE_STRING;
            pFVar9 = extraout_RDX_04;
          }
          else if (AVar4 == AFM_TOKEN_STARTKERNDATA) {
            pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_80,len_01);
            AVar11 = 0xa0;
            goto LAB_0014dea8;
          }
          pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,pFVar9);
        } while (pcVar6 != (char *)0x0);
      }
LAB_0014de44:
      ft_mem_free(memory,pAVar1->TrackKerns);
      pAVar1->TrackKerns = (AFM_TrackKern)0x0;
      pAVar1->NumTrackKern = 0;
      ft_mem_free(memory,pAVar1->KernPairs);
      pAVar1->KernPairs = (AFM_KernPair)0x0;
      pAVar1->NumKernPair = 0;
      pAVar1->IsCIDFont = '\0';
    }
  }
  return AVar10;
LAB_0014dea8:
  AVar10 = AVar11;
  if (pcVar6 == (char *)0x0) goto LAB_0014de44;
  AVar4 = afm_tokenize(pcVar6,local_80);
  if ((int)AVar4 < 0x35) {
    if (1 < AVar4 - AFM_TOKEN_STARTKERNPAIRS) {
      if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) {
        return 0;
      }
      goto LAB_0014de44;
    }
    pAVar2 = parser->FontInfo;
    local_d8.type = AFM_VALUE_TYPE_INTEGER;
    FVar5 = afm_parser_read_vals(parser,&local_d8,1);
    if ((FVar5 == 1) && (-1 < (long)local_d8.u.i)) {
      pAVar2->NumKernPair = local_d8.u.i;
      pFVar9 = extraout_RDX_08;
      if (local_d8.u.i != 0) {
        pAVar7 = (AFM_KernPair)
                 ft_mem_realloc(parser->memory,0x10,0,(long)local_d8.u.i,(void *)0x0,
                                (FT_Error *)&local_d8);
        pAVar2->KernPairs = pAVar7;
        pFVar9 = extraout_RDX_09;
        AVar10 = local_d8.type;
        if (local_d8.type != AFM_VALUE_TYPE_STRING) goto LAB_0014de44;
      }
      pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e8,pFVar9);
      if (pcVar6 != (char *)0x0) {
        uVar13 = 0xffffffff;
        do {
          AVar4 = afm_tokenize(pcVar6,local_e8);
          pFVar9 = (FT_Offset *)(ulong)(AVar4 - AFM_TOKEN_ENDFONTMETRICS);
          if (0x37 < AVar4 - AFM_TOKEN_ENDFONTMETRICS) break;
          if ((0x34000UL >> ((ulong)pFVar9 & 0x3f) & 1) == 0) {
            if (pFVar9 != (FT_Offset *)0x37) goto LAB_0014e1c1;
          }
          else {
            uVar12 = (int)uVar13 + 1;
            if ((int)pAVar2->NumKernPair <= (int)uVar12) break;
            pAVar7 = pAVar2->KernPairs + (int)uVar12;
            local_d8.type = AFM_VALUE_TYPE_INDEX;
            local_c8 = 5;
            local_b8 = 3;
            local_a8 = 3;
            local_38 = (ulong)uVar12;
            FVar5 = afm_parser_read_vals(parser,&local_d8,4);
            if (FVar5 < 3) break;
            pAVar7->index1 = local_d8.u.i;
            pAVar7->index2 = local_c0;
            pFVar9 = (FT_Offset *)0x0;
            uVar12 = local_b0;
            if (AVar4 != AFM_TOKEN_KPY) {
              uVar12 = 0;
              if (FVar5 == 4 && AVar4 == AFM_TOKEN_KP) {
                uVar12 = local_a0;
              }
              pFVar9 = (FT_Offset *)(ulong)local_b0;
            }
            pAVar7->x = (FT_Int)pFVar9;
            pAVar7->y = uVar12;
            uVar13 = local_38;
          }
          pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e8,pFVar9);
          if (pcVar6 == (char *)0x0) break;
        } while( true );
      }
    }
  }
  else {
    pFVar9 = extraout_RDX_07;
    if (AVar4 == AFM_TOKEN_UNKNOWN) goto LAB_0014e20b;
    if (AVar4 != AFM_TOKEN_STARTTRACKKERN) goto LAB_0014de44;
    pAVar2 = parser->FontInfo;
    local_d8.type = AFM_VALUE_TYPE_INTEGER;
    FVar5 = afm_parser_read_vals(parser,&local_d8,1);
    if ((FVar5 == 1) && (-1 < (long)local_d8.u.i)) {
      pAVar2->NumTrackKern = local_d8.u.i;
      pFVar9 = extraout_RDX_10;
      if (local_d8.u.i != 0) {
        pAVar8 = (AFM_TrackKern)
                 ft_mem_realloc(parser->memory,0x28,0,(long)local_d8.u.i,(void *)0x0,
                                (FT_Error *)&local_d8);
        pAVar2->TrackKerns = pAVar8;
        pFVar9 = extraout_RDX_11;
        AVar10 = local_d8.type;
        if (local_d8.type != AFM_VALUE_TYPE_STRING) goto LAB_0014de44;
      }
      pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e8,pFVar9);
      if (pcVar6 != (char *)0x0) {
        iVar3 = -1;
        do {
          AVar4 = afm_tokenize(pcVar6,local_e8);
          if ((int)AVar4 < 0x4b) {
            if (AVar4 != AFM_TOKEN_TRACKKERN) goto LAB_0014e1f2;
            iVar3 = iVar3 + 1;
            if ((int)pAVar2->NumTrackKern <= iVar3) break;
            pAVar8 = pAVar2->TrackKerns;
            local_d8.type = AFM_VALUE_TYPE_INTEGER;
            local_c8 = 2;
            local_b8 = 2;
            local_a8 = 2;
            local_98 = 2;
            FVar5 = afm_parser_read_vals(parser,&local_d8,5);
            if (FVar5 != 5) break;
            pAVar8[iVar3].degree = local_d8.u.i;
            pAVar8[iVar3].min_ptsize = CONCAT44(uStack_bc,local_c0);
            pAVar8[iVar3].min_kern = CONCAT44(uStack_ac,local_b0);
            pAVar8[iVar3].max_ptsize = CONCAT44(uStack_9c,local_a0);
            pAVar8[iVar3].max_kern = local_90;
            pFVar9 = extraout_RDX_13;
          }
          else {
            pFVar9 = extraout_RDX_12;
            if (AVar4 != AFM_TOKEN_UNKNOWN) break;
          }
          pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e8,pFVar9);
          if (pcVar6 == (char *)0x0) break;
        } while( true );
      }
    }
  }
LAB_0014e228:
  AVar10 = 0xa0;
  goto LAB_0014de44;
LAB_0014e1f2:
  if ((AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar4 == AFM_TOKEN_ENDTRACKKERN)) {
    pAVar2->NumTrackKern = iVar3 + 1;
    pFVar9 = extraout_RDX_12;
    goto LAB_0014e20b;
  }
  goto LAB_0014e228;
LAB_0014e1c1:
  AVar10 = 0xa0;
  if ((7UL >> ((ulong)pFVar9 & 0x3f) & 1) == 0) goto LAB_0014de44;
  uVar12 = (int)uVar13 + 1;
  pAVar2->NumKernPair = uVar12;
  qsort(pAVar2->KernPairs,(ulong)uVar12,0x10,afm_compare_kern_pairs);
  pFVar9 = extraout_RDX_14;
LAB_0014e20b:
  pcVar6 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_80,pFVar9);
  goto LAB_0014dea8;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }